

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

void __thiscall Clasp::Clause::detach(Clause *this,Solver *s)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_ClauseHead).field_0.local_.mem[0];
  if ((~uVar1 & 3) == 0) {
    uVar1 = (this->super_ClauseHead).head_[uVar1 >> 3].rep_;
    uVar2 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
    if ((0xf < uVar2) && ((byte)((byte)uVar2 & 3) == (byte)(((uVar1 & 2) == 0) + 1U))) {
      Solver::removeUndoWatch(s,uVar2 >> 4,(Constraint *)this);
    }
  }
  ClauseHead::detach(&this->super_ClauseHead,s);
  return;
}

Assistant:

void Clause::detach(Solver& s) {
	if (contracted()) {
		Literal* eoc = end();
		if (s.isFalse(*eoc) && s.level(eoc->var()) != 0) {
			s.removeUndoWatch(s.level(eoc->var()), this);
		}
	}
	ClauseHead::detach(s);
}